

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLDocument::MarkInUse(XMLDocument *this,XMLNode *node)

{
  int iVar1;
  XMLNode **ppXVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = (this->_unlinked)._size;
  lVar3 = (long)iVar1;
  if (0 < lVar3) {
    ppXVar2 = (this->_unlinked)._mem;
    lVar4 = 0;
    do {
      if (ppXVar2[lVar4] == node) {
        ppXVar2[lVar4] = ppXVar2[lVar3 + -1];
        (this->_unlinked)._size = iVar1 + -1;
        return;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

void XMLDocument::MarkInUse(const XMLNode* const node)
{
	TIXMLASSERT(node);
	TIXMLASSERT(node->_parent == 0);

	for (int i = 0; i < _unlinked.Size(); ++i) {
		if (node == _unlinked[i]) {
			_unlinked.SwapRemove(i);
			break;
		}
	}
}